

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O1

void __thiscall OpenMD::COHZ::postCorrelate(COHZ *this)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  double dVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  uVar7 = (ulong)(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                 super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                 super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_;
  if (uVar7 != 0) {
    uVar1 = this->nZBins_;
    pvVar3 = (this->counts_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        lVar4 = *(long *)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        pvVar5 = (this->histogram_).
                 super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = 0;
        uVar11 = 0;
        do {
          iVar2 = *(int *)(lVar4 + uVar11 * 4);
          if (0 < iVar2) {
            dVar6 = (double)iVar2;
            lVar8 = *(long *)&pvVar5[uVar9].
                              super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                              ._M_impl.super__Vector_impl_data + lVar10;
            lVar12 = 0;
            do {
              auVar13._8_4_ = SUB84(dVar6,0);
              auVar13._0_8_ = dVar6;
              auVar13._12_4_ = (int)((ulong)dVar6 >> 0x20);
              auVar13 = divpd(*(undefined1 (*) [16])(lVar8 + lVar12 * 8),auVar13);
              *(undefined1 (*) [16])(lVar8 + lVar12 * 8) = auVar13;
              lVar12 = lVar12 + 2;
            } while (lVar12 != 4);
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 != uVar1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void COHZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }